

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ExprNodePtr __thiscall punky::par::Parser::parse_if_expression(Parser *this)

{
  _Alloc_hider _Var1;
  undefined8 uVar2;
  Parser *in_RSI;
  bool bVar3;
  OptIfAltBlk alternative;
  unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_> consequence;
  ExprNodePtr condition;
  Token if_tok;
  undefined1 local_70 [32];
  undefined8 local_50;
  TokenType local_48;
  undefined8 local_40;
  undefined8 local_30;
  undefined1 local_20;
  
  local_48 = (in_RSI->m_curr_tok).m_type;
  local_20 = LeftParen;
  bVar3 = (in_RSI->m_curr_tok).m_literal.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true;
  if (bVar3) {
    local_40 = &stack0xffffffffffffffd0;
    _Var1._M_p = (in_RSI->m_curr_tok).m_literal.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xffffffffffffffc0,_Var1._M_p,
               _Var1._M_p +
               *(long *)((long)&(in_RSI->m_curr_tok).m_literal.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload + 8));
  }
  local_70._8_8_ = (ulong)(uint)local_70._12_4_ << 0x20;
  local_20 = bVar3;
  bVar3 = expect_peek_and_consume(in_RSI,(TokenType *)(local_70 + 8));
  if (!bVar3) {
    (this->m_lex).m_line._M_dataplus._M_p = (pointer)0x0;
    goto LAB_0010e63e;
  }
  consume(in_RSI);
  parse_expression((Parser *)&stack0xffffffffffffffb0,(PrecedenceLevel)in_RSI);
  local_70._8_4_ = 1;
  bVar3 = expect_peek_and_consume(in_RSI,(TokenType *)(local_70 + 8));
  if (bVar3) {
    local_70._8_4_ = 4;
    bVar3 = expect_peek_and_consume(in_RSI,(TokenType *)(local_70 + 8));
    if (!bVar3) goto LAB_0010e627;
    parse_block_statement((Parser *)(local_70 + 0x18));
    local_70[0x10] = '\0';
    if ((in_RSI->m_peek_tok).m_type == Else) {
      consume(in_RSI);
      local_70._0_4_ = 4;
      bVar3 = expect_peek_and_consume(in_RSI,(TokenType *)local_70);
      if (bVar3) {
        parse_block_statement((Parser *)local_70);
        uVar2 = local_70._8_8_;
        local_70._8_8_ = local_70._0_8_;
        if (local_70[0x10] == '\x01') {
          local_70._0_8_ = (long *)0x0;
          if ((pointer)uVar2 != (pointer)0x0) {
            (**(code **)(*(long *)uVar2 + 8))();
          }
        }
        else {
          local_70._0_8_ = (long *)0x0;
          local_70[0x10] = '\x01';
        }
        if ((long *)local_70._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_70._0_8_ + 8))();
        }
        goto LAB_0010e6a2;
      }
      (this->m_lex).m_line._M_dataplus._M_p = (pointer)0x0;
    }
    else {
LAB_0010e6a2:
      std::
      make_unique<punky::ast::IfExpression,punky::tok::Token&,std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>,std::unique_ptr<punky::ast::BlockStmt,std::default_delete<punky::ast::BlockStmt>>,std::optional<std::unique_ptr<punky::ast::BlockStmt,std::default_delete<punky::ast::BlockStmt>>>>
                ((Token *)local_70,
                 (unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_> *)
                 &stack0xffffffffffffffb8,
                 (unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_> *)
                 &stack0xffffffffffffffb0,
                 (optional<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
                  *)(local_70 + 0x18));
      uVar2 = local_70._0_8_;
      local_70._0_8_ = (long *)0x0;
      (this->m_lex).m_line._M_dataplus._M_p = (pointer)uVar2;
    }
    if (local_70[0x10] == '\x01') {
      local_70[0x10] = '\0';
      if ((pointer)local_70._8_8_ != (pointer)0x0) {
        (**(code **)(*(long *)local_70._8_8_ + 8))();
      }
      local_70._8_8_ = (pointer)0x0;
    }
    if ((long *)local_70._24_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_70._24_8_ + 8))();
    }
  }
  else {
LAB_0010e627:
    (this->m_lex).m_line._M_dataplus._M_p = (pointer)0x0;
  }
  if ((long *)local_50 != (long *)0x0) {
    (**(code **)(*(long *)local_50 + 8))();
  }
LAB_0010e63e:
  if (local_20 == RightParen) {
    local_20 = LeftParen;
    if ((undefined8 *)local_40 != &stack0xffffffffffffffd0) {
      operator_delete((void *)local_40,(ulong)(local_30 + 1));
    }
  }
  return (__uniq_ptr_data<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>,_true,_true>
          )(__uniq_ptr_data<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>,_true,_true>
            )this;
}

Assistant:

auto Parser::parse_if_expression() -> ast::ExprNodePtr
{
    auto if_tok = m_curr_tok;

    if (!expect_peek_and_consume(TokenType::LeftParen))
        return nullptr;
    consume();

    auto condition = parse_expression(PrecedenceLevel::Lowest);

    if (!expect_peek_and_consume(TokenType::RightParen))
        return nullptr;
    if (!expect_peek_and_consume(TokenType::LeftBrace))
        return nullptr;

    auto consequence = parse_block_statement();

    ast::OptIfAltBlk alternative;
    if (peek_type_is(TokenType::Else))
    {
        consume();
        if (!expect_peek_and_consume(TokenType::LeftBrace))
            return nullptr;

        alternative = parse_block_statement();
    }

    return std::make_unique<ast::IfExpression>(if_tok, std::move(condition),
                                               std::move(consequence), std::move(alternative));
}